

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::CChat(CChat *this)

{
  CCommandManager *pCVar1;
  CComponent *in_RDI;
  char *in_stack_ffffffffffffffa8;
  CLineInput *this_00;
  CLineInput *in_stack_ffffffffffffffc0;
  CCommandManager *local_30;
  
  CComponent::CComponent(in_RDI);
  in_RDI->_vptr_CComponent = (_func_int **)&PTR__CChat_00298648;
  CLineInput::CLineInput(in_stack_ffffffffffffffc0);
  pCVar1 = (CCommandManager *)(in_RDI + 0x2b);
  do {
    local_30 = pCVar1;
    CLine::CLine((CLine *)0x14bbec);
    pCVar1 = (CCommandManager *)&local_30[0xc].m_pfnRemoveCommandHook;
  } while ((CComponent *)&local_30[0xc].m_pfnRemoveCommandHook != in_RDI + 0x25c4);
  TStaticRingBuffer<CChat::CHistoryEntry,_65536,_1>::TStaticRingBuffer
            ((TStaticRingBuffer<CChat::CHistoryEntry,_65536,_1> *)0x14bc19);
  array<bool,_allocator_default<bool>_>::array((array<bool,_allocator_default<bool>_> *)0x14bc31);
  this_00 = (CLineInput *)&in_RDI[0x363f].m_pClient;
  CCommandManager::CCommandManager(local_30);
  *(undefined1 *)&in_RDI[1]._vptr_CComponent = 0;
  CLineInput::SetBuffer(this_00,in_stack_ffffffffffffffa8,0);
  return;
}

Assistant:

CChat::CChat()
{
	m_aInputBuf[0] = '\0';
	m_Input.SetBuffer(m_aInputBuf, sizeof(m_aInputBuf));
}